

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_test.cxx
# Opt level: O0

void __thiscall uint32_array_digest_test::test_method(uint32_array_digest_test *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *prev;
  basic_cstring<const_char> local_b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_a8;
  basic_cstring<const_char> local_80 [2];
  basic_cstring<const_char> local_60;
  cryptox local_50 [8];
  string str;
  undefined1 local_30 [8];
  digest_type hash;
  type array;
  uint32_array_digest_test *this_local;
  
  hash._M_elems[8] = '\0';
  hash._M_elems[9] = '\0';
  hash._M_elems[10] = '\0';
  hash._M_elems[0xb] = '\0';
  hash._M_elems[0xc] = '\x11';
  hash._M_elems[0xd] = '\x11';
  hash._M_elems[0xe] = '\x11';
  hash._M_elems[0xf] = '\x11';
  _local_30 = cryptox::
              digest<cryptox::message_digest_algorithm<&EVP_md5,128ul>,std::array<unsigned_int,4ul>>
                        ((array<unsigned_int,_4UL> *)(hash._M_elems + 8));
  cryptox::to_hex<std::array<unsigned_char,16ul>>(local_50,(array<unsigned_char,_16UL> *)local_30);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/digest_test.cxx"
               ,0x75);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(local_80);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_60,0x3d,local_80);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_a8,prev,(char (*) [1])0x37c1a9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b8,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/digest_test.cxx"
               ,0x75);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[33]>
              (&local_a8,&local_b8,0x3d,1,2,local_50,"str","89dfed81253840a81164dee0ed6be878",
               "\"89dfed81253840a81164dee0ed6be878\"");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(uint32_array_digest_test) {
	const cryptox::array<std::uint32_t, 4>::type array = {
		0x00000000, 0x11111111,
		0x22222222, 0x33333333
	};

	const md5::digest_type hash = digest<md5>(array);
	const std::string str = to_hex(hash);
	BOOST_CHECK_EQUAL(str, "89dfed81253840a81164dee0ed6be878");
}